

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relocations.cpp
# Opt level: O0

void ast::Relocations::print(ostream *os)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  Relocation *pRVar7;
  char *pcVar8;
  bool bVar9;
  reference ppRVar10;
  undefined8 uVar11;
  char *local_70;
  Relocation *reloc;
  iterator __end1;
  iterator __begin1;
  list<ast::Relocation_*,_std::allocator<ast::Relocation_*>_> *__range1;
  ostream *os_local;
  
  ostream_printf(os,"File       Line Section Offset Pos Mask Type    Addend Symbol\n");
  __end1 = std::__cxx11::list<ast::Relocation_*,_std::allocator<ast::Relocation_*>_>::begin
                     ((list<ast::Relocation_*,_std::allocator<ast::Relocation_*>_> *)list_abi_cxx11_
                     );
  reloc = (Relocation *)
          std::__cxx11::list<ast::Relocation_*,_std::allocator<ast::Relocation_*>_>::end
                    ((list<ast::Relocation_*,_std::allocator<ast::Relocation_*>_> *)list_abi_cxx11_)
  ;
  while( true ) {
    bVar9 = std::operator!=(&__end1,(_Self *)&reloc);
    if (!bVar9) break;
    ppRVar10 = std::_List_iterator<ast::Relocation_*>::operator*(&__end1);
    pRVar7 = *ppRVar10;
    pcVar8 = pRVar7->location->unit;
    uVar1 = pRVar7->location->line;
    uVar2 = pRVar7->section_index;
    uVar3 = pRVar7->section_offset;
    uVar4 = pRVar7->position;
    uVar5 = pRVar7->width;
    if (pRVar7->type == ABSOLUTE) {
      local_70 = "ABSOLUTE";
    }
    else {
      local_70 = "RELATIVE";
    }
    iVar6 = pRVar7->addend;
    uVar11 = std::__cxx11::string::c_str();
    ostream_printf(os,"%-10s %4d %3d %7d %4d  %04x %s %6d %-10s\n",pcVar8,(ulong)uVar1,(ulong)uVar2,
                   (ulong)uVar3,uVar4,-1 << ((byte)uVar5 & 0x1f) ^ 0xffffffff,local_70,iVar6,uVar11)
    ;
    std::_List_iterator<ast::Relocation_*>::operator++(&__end1);
  }
  return;
}

Assistant:

void Relocations::print(ostream & os)
{
	ostream_printf(os, "File       Line Section Offset Pos Mask Type    Addend Symbol\n");
	for (auto reloc: list) {
		ostream_printf(os, "%-10s %4d %3d %7d %4d  %04x %s %6d %-10s\n",
				reloc->location->unit, reloc->location->line,
				reloc->section_index, reloc->section_offset,
				reloc->position, MAKE_MASK(reloc->width, 0),
				reloc->type == Relocation::Relocation_type::ABSOLUTE ? "ABSOLUTE" : "RELATIVE",
				reloc->addend, reloc->symbol.c_str());
	}
}